

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O1

void __thiscall CircularArrayTest_at_Test::TestBody(CircularArrayTest_at_Test *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_60 [9];
  undefined7 uStack_57;
  AssertHelper local_50;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> local_48;
  
  lVar2 = 0;
  do {
    (&local_48.contents_._M_elems[0].moved)[lVar2] = false;
    *(undefined8 *)((long)&local_48.contents_._M_elems[0].data + lVar2) = 0;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x18);
  local_48.size_ = 0;
  local_48.front_ = 0;
  local_60._0_4_ = 1;
  local_60._4_4_ = 0;
  local_60[8] = false;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 3;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&local_48,(value_type *)local_60);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_60._0_4_ = 2;
  local_60._4_4_ = 0;
  local_60[8] = false;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 1;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&local_48,(value_type *)local_60);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_68.ptr_._0_4_ = 1;
  if (local_48.size_ == 0) {
LAB_001d3576:
    __assert_fail("index < size_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/circular-array.h"
                  ,0x34,
                  "reference wabt::CircularArray<(anonymous namespace)::TestObject, 2>::at(size_type) [T = (anonymous namespace)::TestObject, kCapacity = 2]"
                 );
  }
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,"1","ca.at(0).data",(int *)&local_68,
             &local_48.contents_._M_elems[(uint)local_48.front_ & 1].data);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)CONCAT71(uStack_57,local_60[8]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(uStack_57,local_60[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-circular-array.cc"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_60 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    local_68.ptr_._0_4_ = 2;
    if (local_48.size_ < 2) goto LAB_001d3576;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_60,"2","ca.at(1).data",(int *)&local_68,
               &local_48.contents_._M_elems[~(uint)local_48.front_ & 1].data);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)CONCAT71(uStack_57,local_60[8]) == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT71(uStack_57,local_60[8]);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-circular-array.cc"
                 ,0x79,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_60 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray(&local_48);
  return;
}

Assistant:

TEST_F(CircularArrayTest, at) {
  CircularArray<TestObject, 2> ca;
  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));

  ASSERT_EQ(1, ca.at(0).data);
  ASSERT_EQ(2, ca.at(1).data);
}